

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
          (any *this,shared_ptr<cs::name_space> *args)

{
  proxy *ppVar1;
  int local_28;
  int local_24;
  holder<std::shared_ptr<cs::name_space>_> *local_20;
  
  local_28 = 1;
  local_24 = local_28;
  local_20 = cs::
             allocator_type<cs_impl::any::holder<std::shared_ptr<cs::name_space>>,64ul,cs_impl::default_allocator_provider>
             ::alloc<std::shared_ptr<cs::name_space>const&>
                       ((allocator_type<cs_impl::any::holder<std::shared_ptr<cs::name_space>>,64ul,cs_impl::default_allocator_provider>
                         *)holder<std::shared_ptr<cs::name_space>>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<std::shared_ptr<cs::name_space>>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_24,&local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}